

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O3

void __thiscall Args::HelpPrinter::~HelpPrinter(HelpPrinter *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_HelpPrinterIface)._vptr_HelpPrinterIface = (_func_int **)&PTR__HelpPrinter_00115b78;
  pcVar1 = (this->m_appDescription)._M_dataplus._M_p;
  paVar2 = &(this->m_appDescription).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_exeName)._M_dataplus._M_p;
  paVar2 = &(this->m_exeName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

inline
HelpPrinter::~HelpPrinter()
{
}